

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O3

void mcsin(mcscxdef *ctx,mcsseg seg,uchar *ptr,ushort siz)

{
  ushort uVar1;
  mcsdsdef *pmVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  undefined6 in_register_00000032;
  
  uVar5 = (ulong)seg & 0xff;
  pmVar2 = ctx->mcscxtab[CONCAT62(in_register_00000032,seg) >> 8 & 0xffffff];
  uVar1 = pmVar2[uVar5].mcsdsosz;
  iVar3 = fseek((FILE *)ctx->mcscxfp,pmVar2[uVar5].mcsdsptr,0);
  if (iVar3 != 0) {
    errsigf(ctx->mcscxerr,"TADS",2);
  }
  if (uVar1 < siz) {
    siz = uVar1;
  }
  sVar4 = fread(ptr,(ulong)siz,1,(FILE *)ctx->mcscxfp);
  if (sVar4 == 1) {
    *(byte *)&pmVar2[uVar5].mcsdsflg = (byte)pmVar2[uVar5].mcsdsflg & 0xfe;
    return;
  }
  errsigf(ctx->mcscxerr,"TADS",3);
}

Assistant:

void mcsin(mcscxdef *ctx, mcsseg seg, uchar *ptr, ushort siz)
{
    mcsdsdef *desc = mcsdsc(ctx, seg);

    IF_DEBUG(printf("<< mcsin: seg=%u, ptr=%lx, siz=%d, objid=%u >>\n",
                    seg, (unsigned long)ptr, siz, desc->mcsdsobj));

    assert(seg < ctx->mcscxmsg);

    /* can only swap in as much as we wrote */
    if (desc->mcsdsosz < siz) siz = desc->mcsdsosz;

    /* seek to and read the segment */
    if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
        errsig(ctx->mcscxerr, ERR_FSEEK);
    if (osfrb(ctx->mcscxfp, ptr, (size_t)siz))
        errsig(ctx->mcscxerr, ERR_FREAD);
    
    desc->mcsdsflg &= ~MCSDSFINUSE;             /* segment no longer in use */
}